

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::diceHistoricalValues(Dice *this)

{
  ostream *poVar1;
  pointer pmVar2;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *pmVar3;
  _Base_ptr p_Var4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Dice container values for player ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->playerNumber);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  pmVar2 = (this->historyOfRolls).
           super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while ((this->it)._M_current = pmVar2,
        pmVar2 != (this->historyOfRolls).
                  super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<((ostream *)&std::cout,"| Dice Roll # ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-----------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    pmVar3 = (this->it)._M_current;
    p_Var4 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
      *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f |
           0x20;
      poVar1 = std::operator<<((ostream *)&std::cout,"| ");
      poVar1 = std::operator<<(poVar1,"(");
      poVar1 = std::operator<<(poVar1,*this->DiceNames[p_Var4[1]._M_color]);
      poVar1 = std::operator<<(poVar1,") --- ");
      poVar1 = std::operator<<(poVar1,this->DiceNames[p_Var4[1]._M_color]);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)&p_Var4[1].field_0x4);
      std::endl<char,std::char_traits<char>>(poVar1);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      pmVar3 = (this->it)._M_current;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-----------------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
    pmVar2 = (this->it)._M_current + 1;
  }
  return;
}

Assistant:

void Dice::diceHistoricalValues()
{
    cout << "Dice container values for player "<< this->getPlayerNumber() << endl;
    cout << "-----------------------------------------------------------------" << endl;
    for (it = historyOfRolls.begin(); it != historyOfRolls.end(); ++it) {
        cout << "| Dice Roll # "<< it - historyOfRolls.begin() +1 << endl;
        cout << "-----------------------------------------------------------------" << endl;

        for (auto mapIt(it->begin()); mapIt != it->end(); ++mapIt) {

            std::cout << left << "| " << "(" << DiceNames[mapIt->first][0] << ") --- " << DiceNames[mapIt->first] << ", " << mapIt->second << std::endl;
        }
        cout << "-----------------------------------------------------------------" << endl;

    }


}